

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

void luaT_getvarargs(lua_State *L,CallInfo *ci,StkId where,int wanted)

{
  uint n;
  StkId pSVar1;
  uint uVar2;
  ulong uVar3;
  lu_byte *plVar4;
  ulong uVar5;
  long lVar6;
  
  n = (ci->u).l.nextraargs;
  if (wanted < 0) {
    if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(int)n) {
      lVar6 = (L->stack).offset;
      luaD_growstack(L,n,1);
      where = (StkId)(((long)where - lVar6) + (long)(L->stack).p);
    }
    (L->top).p = where + (int)n;
    wanted = n;
  }
  uVar2 = n;
  if (wanted < (int)n) {
    uVar2 = wanted;
  }
  uVar3 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar3;
  }
  lVar6 = (long)(int)n * -0x10 + 8;
  for (; uVar5 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    pSVar1 = (ci->func).p;
    *(undefined8 *)((long)where + uVar3) = *(undefined8 *)((long)pSVar1 + (uVar3 - 8) + lVar6);
    *(undefined1 *)((long)where + uVar3 + 8) = *(undefined1 *)((long)pSVar1 + uVar3 + lVar6);
  }
  plVar4 = &(&where->val)[uVar5].tt_;
  for (; (long)uVar5 < (long)wanted; uVar5 = uVar5 + 1) {
    *plVar4 = '\0';
    plVar4 = plVar4 + 0x10;
  }
  return;
}

Assistant:

void luaT_getvarargs (lua_State *L, CallInfo *ci, StkId where, int wanted) {
  int i;
  int nextra = ci->u.l.nextraargs;
  if (wanted < 0) {
    wanted = nextra;  /* get all extra arguments available */
    checkstackp(L, nextra, where);  /* ensure stack space */
    L->top.p = where + nextra;  /* next instruction will need top */
  }
  for (i = 0; i < wanted && i < nextra; i++)
    setobjs2s(L, where + i, ci->func.p - nextra + i);
  for (; i < wanted; i++)   /* complete required results with nil */
    setnilvalue(s2v(where + i));
}